

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

void file_read_aligned_cold_1(void)

{
  fprintf(_stderr,"%s:%d: ",
          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/common.c",0x1b);
  fwrite("fseek to end failed.\n",0x15,1,_stderr);
  return;
}

Assistant:

static Result get_file_size(FILE* f, long* out_size) {
  CHECK_MSG(fseek(f, 0, SEEK_END) >= 0, "fseek to end failed.\n");
  long size = ftell(f);
  CHECK_MSG(size >= 0, "ftell failed.");
  CHECK_MSG(fseek(f, 0, SEEK_SET) >= 0, "fseek to beginning failed.\n");
  *out_size = size;
  return OK;
  ON_ERROR_RETURN;
}